

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Aig_ManCheckAcyclic(Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint local_28;
  int local_24;
  int i;
  int fAcyclic;
  Aig_Obj_t *pNode;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  local_24 = 1;
  local_28 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vCos);
    if (iVar1 <= (int)local_28) {
      return local_24;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_28);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar2);
    if ((iVar1 == 0) && (local_24 = Aig_ManCheckAcyclic_rec(p,pAVar2,fVerbose), local_24 == 0))
    break;
    local_28 = local_28 + 1;
  }
  if (fVerbose == 0) {
    return 0;
  }
  Abc_Print(1," CO %d\n",(ulong)local_28);
  return 0;
}

Assistant:

int Aig_ManCheckAcyclic( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Aig_ManIncrementTravId( p );   
    Aig_ManIncrementTravId( p );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Aig_ManForEachCo( p, pNode, i )
    {
        pNode = Aig_ObjFanin0(pNode);
        if ( Aig_ObjIsTravIdPrevious(p, pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pNode, fVerbose)) )
            continue;
        // stop as soon as the first loop is detected
        if ( fVerbose )
        Abc_Print( 1, " CO %d\n", i );
        break;
    }
    return fAcyclic;
}